

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::AsymEncryptInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  int iVar2;
  int iVar3;
  Session *this_00;
  Token *token;
  SoftHSM *key;
  CK_STATE sessionState;
  long lVar4;
  CryptoFactory *pCVar5;
  SoftHSM *pSVar6;
  RSAPublicKey *publicKey;
  Type inMechanism;
  SoftHSM *this_01;
  CK_RV CVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  CVar7 = 400;
  if (this->isInitialised == true) {
    if (pMechanism == (CK_MECHANISM_PTR)0x0) {
      CVar7 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar7 = 0xb3;
      }
      else {
        iVar2 = Session::getOpType(this_00);
        CVar7 = 0x90;
        if (iVar2 == 0) {
          token = Session::getToken(this_00);
          CVar7 = 5;
          if (token != (Token *)0x0) {
            key = (SoftHSM *)HandleManager::getObject(this->handleManager,hKey);
            CVar7 = 0x82;
            if ((key != (SoftHSM *)0x0) &&
               (iVar2 = (*key->_vptr_SoftHSM[10])(key), (char)iVar2 != '\0')) {
              iVar2 = (*key->_vptr_SoftHSM[4])(key,1,0);
              iVar3 = (*key->_vptr_SoftHSM[4])(key,2,1);
              sessionState = Session::getState(this_00);
              CVar7 = haveRead(sessionState,(CK_BBOOL)iVar2,(CK_BBOOL)iVar3);
              if (CVar7 == 0) {
                iVar2 = (*key->_vptr_SoftHSM[4])(key,0x104,0);
                CVar7 = 0x68;
                if ((char)iVar2 != '\0') {
                  pSVar6 = key;
                  iVar2 = (*key->_vptr_SoftHSM[5])(key,0x100,0x80000000);
                  lVar4 = CONCAT44(extraout_var,iVar2);
                  CVar1 = pMechanism->mechanism;
                  if (CVar1 == 9) {
                    if (lVar4 != 0) {
                      return 99;
                    }
                    CVar7 = MechParamCheckRSAPKCSOAEP(pSVar6,pMechanism);
                    if (CVar7 != 0) {
                      return CVar7;
                    }
                    inMechanism = RSA_PKCS_OAEP;
                  }
                  else if (CVar1 == 3) {
                    if (lVar4 != 0) {
                      return 99;
                    }
                    inMechanism = RSA;
                  }
                  else {
                    if (CVar1 != 1) {
                      return 0x70;
                    }
                    if (lVar4 != 0) {
                      return 99;
                    }
                    inMechanism = RSA_PKCS;
                  }
                  pCVar5 = CryptoFactory::i();
                  iVar2 = (*pCVar5->_vptr_CryptoFactory[2])(pCVar5,1);
                  pSVar6 = (SoftHSM *)CONCAT44(extraout_var_00,iVar2);
                  CVar7 = 0x70;
                  if (pSVar6 != (SoftHSM *)0x0) {
                    this_01 = pSVar6;
                    iVar2 = (*pSVar6->_vptr_SoftHSM[0x15])();
                    publicKey = (RSAPublicKey *)CONCAT44(extraout_var_01,iVar2);
                    if (publicKey == (RSAPublicKey *)0x0) {
                      pCVar5 = CryptoFactory::i();
                      (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,pSVar6);
                      CVar7 = 2;
                    }
                    else {
                      CVar7 = getRSAPublicKey(this_01,publicKey,token,(OSObject *)key);
                      if (CVar7 == 0) {
                        Session::setOpType(this_00,2);
                        Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)pSVar6);
                        Session::setMechanism(this_00,inMechanism);
                        CVar7 = 0;
                        Session::setAllowMultiPartOp(this_00,false);
                        Session::setAllowSinglePartOp(this_00,true);
                        Session::setPublicKey(this_00,(PublicKey *)publicKey);
                      }
                      else {
                        (*pSVar6->_vptr_SoftHSM[0x1a])(pSVar6,publicKey);
                        pCVar5 = CryptoFactory::i();
                        (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,pSVar6);
                        CVar7 = 5;
                      }
                    }
                  }
                }
              }
              else if (CVar7 == 0x101) {
                softHSMLog(6,"AsymEncryptInit",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x97d,"User is not authorized");
              }
            }
          }
        }
      }
    }
  }
  return CVar7;
}

Assistant:

CK_RV SoftHSM::AsymEncryptInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for encryption
	if (!key->getBooleanValue(CKA_ENCRYPT, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism;
	bool isRSA = false;
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			mechanism = AsymMech::RSA_PKCS;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			mechanism = AsymMech::RSA;
			isRSA = true;
			break;
		case CKM_RSA_PKCS_OAEP:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			rv = MechParamCheckRSAPKCSOAEP(pMechanism);
			if (rv != CKR_OK)
				return rv;

			mechanism = AsymMech::RSA_PKCS_OAEP;
			isRSA = true;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PublicKey* publicKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPublicKey((RSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else
	{
		return CKR_MECHANISM_INVALID;
        }

	session->setOpType(SESSION_OP_ENCRYPT);
	session->setAsymmetricCryptoOp(asymCrypto);
	session->setMechanism(mechanism);
	session->setAllowMultiPartOp(false);
	session->setAllowSinglePartOp(true);
	session->setPublicKey(publicKey);

	return CKR_OK;
}